

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall
Assimp::ValidateDSProcess::DoValidation<aiAnimation>
          (ValidateDSProcess *this,aiAnimation **parray,uint size,char *firstName,char *secondName)

{
  uint local_34;
  uint i;
  char *secondName_local;
  char *firstName_local;
  uint size_local;
  aiAnimation **parray_local;
  ValidateDSProcess *this_local;
  
  if (size != 0) {
    if (parray == (aiAnimation **)0x0) {
      ReportError(this,"aiScene::%s is NULL (aiScene::%s is %i)",firstName,secondName,(ulong)size);
    }
    for (local_34 = 0; local_34 < size; local_34 = local_34 + 1) {
      if (parray[local_34] == (aiAnimation *)0x0) {
        ReportError(this,"aiScene::%s[%i] is NULL (aiScene::%s is %i)",firstName,(ulong)local_34,
                    secondName,(ulong)size);
      }
      Validate(this,parray[local_34]);
    }
  }
  return;
}

Assistant:

inline
void ValidateDSProcess::DoValidation(T** parray, unsigned int size, const char* firstName, const char* secondName) {
    // validate all entries
    if (size)
    {
        if (!parray)
        {
            ReportError("aiScene::%s is NULL (aiScene::%s is %i)",
                firstName, secondName, size);
        }
        for (unsigned int i = 0; i < size;++i)
        {
            if (!parray[i])
            {
                ReportError("aiScene::%s[%i] is NULL (aiScene::%s is %i)",
                    firstName,i,secondName,size);
            }
            Validate(parray[i]);
        }
    }
}